

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O1

void __thiscall Qentem::Value<char16_t>::reset(Value<char16_t> *this)

{
  ValueType VVar1;
  
  VVar1 = this->type_;
  if (VVar1 == String) {
    String<char16_t>::deallocate((String<char16_t> *)this);
    (this->field_0).array_.storage_ = (Value<char16_t> *)0x0;
    (this->field_0).array_.index_ = 0;
  }
  else {
    if (VVar1 == Array) {
      Array<Qentem::Value<char16_t>_>::Reset((Array<Qentem::Value<char16_t>_> *)this);
      return;
    }
    if (VVar1 == Object) {
      HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
      ::Reset((HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
               *)this);
      return;
    }
    (this->field_0).array_.storage_ = (Value<char16_t> *)0x0;
  }
  return;
}

Assistant:

void reset() noexcept {
        switch (Type()) {
            case ValueType::Object: {
                object_.Reset();
                break;
            }

            case ValueType::Array: {
                array_.Reset();
                break;
            }

            case ValueType::String: {
                string_.Reset();
                break;
            }

            default: {
                number_.Natural = SizeT64{0};
            }
        }
    }